

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eepromtool.c
# Opt level: O2

int output_bin(char *fname,int length)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  ulong uVar3;
  
  __stream = fopen(fname,"wb");
  if (__stream == (FILE *)0x0) {
    iVar1 = 0;
  }
  else {
    uVar3 = 0;
    uVar2 = (ulong)(uint)length;
    if (length < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      fputc((uint)ebuf[uVar3],__stream);
    }
    fclose(__stream);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int output_bin(char *fname, int length)
{
   FILE *fp;
 
   int cc;

   fp = fopen(fname, "wb");
   if(fp == NULL) 
      return 0;
   for (cc = 0 ; cc < length ; cc++)
      fputc( ebuf[cc], fp);
   fclose(fp);
   
   return 1;
}